

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O1

void __thiscall wasm::PassRunner::PassRunner(PassRunner *this,PassRunner *runner)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  MixedArena *pMVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  undefined1 uVar6;
  int iVar7;
  int iVar8;
  Index IVar9;
  Index IVar10;
  Index IVar11;
  bool bVar12;
  undefined3 uVar13;
  Index IVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined4 uVar19;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
  local_28;
  __alloc_node_gen_t __alloc_node_gen;
  
  this->_vptr_PassRunner = (_func_int **)&PTR__PassRunner_00d875f8;
  pMVar2 = runner->allocator;
  this->wasm = runner->wasm;
  this->allocator = pMVar2;
  (this->passes).
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->passes).
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->passes).
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = (runner->options).validate;
  bVar5 = (runner->options).validateGlobally;
  uVar6 = (runner->options).field_0x3;
  iVar7 = (runner->options).optimizeLevel;
  iVar8 = (runner->options).shrinkLevel;
  IVar9 = (runner->options).inlining.alwaysInlineMaxSize;
  IVar10 = (runner->options).inlining.oneCallerInlineMaxSize;
  IVar11 = (runner->options).inlining.flexibleInlineMaxSize;
  bVar12 = (runner->options).inlining.allowFunctionsWithLoops;
  uVar13 = *(undefined3 *)&(runner->options).inlining.field_0xd;
  IVar14 = (runner->options).inlining.partialInliningIfs;
  (this->options).debug = (runner->options).debug;
  (this->options).validate = bVar4;
  (this->options).validateGlobally = bVar5;
  (this->options).field_0x3 = uVar6;
  (this->options).optimizeLevel = iVar7;
  (this->options).shrinkLevel = iVar8;
  (this->options).inlining.alwaysInlineMaxSize = IVar9;
  (this->options).inlining.oneCallerInlineMaxSize = IVar10;
  (this->options).inlining.flexibleInlineMaxSize = IVar11;
  (this->options).inlining.allowFunctionsWithLoops = bVar12;
  *(undefined3 *)&(this->options).inlining.field_0xd = uVar13;
  (this->options).inlining.partialInliningIfs = IVar14;
  bVar4 = (runner->options).trapsNeverHappen;
  bVar5 = (runner->options).lowMemoryUnused;
  bVar12 = (runner->options).fastMath;
  bVar15 = (runner->options).zeroFilledMemory;
  bVar16 = (runner->options).closedWorld;
  bVar17 = (runner->options).debugInfo;
  bVar18 = (runner->options).targetJS;
  (this->options).ignoreImplicitTraps = (runner->options).ignoreImplicitTraps;
  (this->options).trapsNeverHappen = bVar4;
  (this->options).lowMemoryUnused = bVar5;
  (this->options).fastMath = bVar12;
  (this->options).zeroFilledMemory = bVar15;
  (this->options).closedWorld = bVar16;
  (this->options).debugInfo = bVar17;
  (this->options).targetJS = bVar18;
  local_28._M_h = (__hashtable_alloc *)&(this->options).arguments;
  (this->options).arguments._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->options).arguments._M_h._M_bucket_count = (runner->options).arguments._M_h._M_bucket_count;
  (this->options).arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->options).arguments._M_h._M_element_count =
       (runner->options).arguments._M_h._M_element_count;
  uVar19 = *(undefined4 *)&(runner->options).arguments._M_h._M_rehash_policy.field_0x4;
  sVar3 = (runner->options).arguments._M_h._M_rehash_policy._M_next_resize;
  (this->options).arguments._M_h._M_rehash_policy._M_max_load_factor =
       (runner->options).arguments._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->options).arguments._M_h._M_rehash_policy.field_0x4 = uVar19;
  (this->options).arguments._M_h._M_rehash_policy._M_next_resize = sVar3;
  (this->options).arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_28._M_h,&(runner->options).arguments._M_h,&local_28);
  local_28._M_h = (__hashtable_alloc *)&(this->options).passesToSkip;
  (this->options).passesToSkip._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->options).passesToSkip._M_h._M_bucket_count =
       (runner->options).passesToSkip._M_h._M_bucket_count;
  (this->options).passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->options).passesToSkip._M_h._M_element_count =
       (runner->options).passesToSkip._M_h._M_element_count;
  uVar19 = *(undefined4 *)&(runner->options).passesToSkip._M_h._M_rehash_policy.field_0x4;
  sVar3 = (runner->options).passesToSkip._M_h._M_rehash_policy._M_next_resize;
  (this->options).passesToSkip._M_h._M_rehash_policy._M_max_load_factor =
       (runner->options).passesToSkip._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->options).passesToSkip._M_h._M_rehash_policy.field_0x4 = uVar19;
  (this->options).passesToSkip._M_h._M_rehash_policy._M_next_resize = sVar3;
  (this->options).passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_28._M_h,&(runner->options).passesToSkip._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              *)&local_28);
  (this->options).funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (runner->options).funcEffectsMap.
            super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var1 = (runner->options).funcEffectsMap.
           super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->options).funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->isNested = true;
  this->addedPassesRemovedDWARF = false;
  this->ran = false;
  (this->skippedPasses)._M_h._M_buckets = &(this->skippedPasses)._M_h._M_single_bucket;
  (this->skippedPasses)._M_h._M_bucket_count = 1;
  (this->skippedPasses)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->skippedPasses)._M_h._M_element_count = 0;
  (this->skippedPasses)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->skippedPasses)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->skippedPasses)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

explicit PassRunner(const PassRunner* runner)
    : wasm(runner->wasm), allocator(runner->allocator),
      options(runner->options), isNested(true) {}